

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinDeserializer<std::array<int,_6UL>,_void>::resize
               (undefined8 param_1,uint param_2)

{
  runtime_error *this;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (param_2 == 6) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_88,param_2);
  std::operator+(&local_68,"Serialized sequence size = ",&local_88);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar2) {
    local_e8.field_2._M_allocated_capacity = *psVar2;
    local_e8.field_2._8_8_ = plVar1[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar2;
  }
  local_e8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_a8,6);
  std::operator+(&local_48,&local_e8,&local_a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_c8 == plVar3) {
    local_b8 = *plVar3;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar3;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void resize(std::false_type /* no resize */, Sequence& s, std::uint32_t new_size)
  {
    const auto size = sequence_size(s);
    if (size != new_size)
    {
      throw std::runtime_error(
        "Serialized sequence size = " + std::to_string(new_size)
        + " != " + std::to_string(size) + " = target size, "
        "and target cannot be .resize()-ed"
      );
    }
  }